

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_progress(nk_context *ctx,nk_size *cur,nk_size max,int is_modifyable)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_size nVar3;
  nk_widget_layout_states nVar4;
  nk_size nVar5;
  nk_context *local_78;
  nk_size old_value;
  undefined1 auStack_60 [4];
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_style *style;
  nk_panel *layout;
  nk_window *win;
  int is_modifyable_local;
  nk_size max_local;
  nk_size *cur_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5376,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if (cur == (nk_size *)0x0) {
    __assert_fail("cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5377,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5378,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5379,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
      (ctx->current->layout == (nk_panel *)0x0)) || (cur == (nk_size *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    nVar4 = nk_widget((nk_rect *)auStack_60,ctx);
    if (nVar4 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = 0;
    }
    else {
      if ((nVar4 == NK_WIDGET_ROM) || (local_78 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_78 = (nk_context *)0x0;
      }
      bounds._8_8_ = local_78;
      nVar3 = *cur;
      nVar5 = nk_do_progress(&ctx->last_widget_state,&pnVar1->buffer,_auStack_60,*cur,max,
                             is_modifyable,&(ctx->style).progress,&local_78->input);
      *cur = nVar5;
      ctx_local._4_4_ = (uint)(*cur != nVar3);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_progress(struct nk_context *ctx, nk_size *cur, nk_size max, int is_modifyable)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_input *in;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;
    nk_size old_value;

    NK_ASSERT(ctx);
    NK_ASSERT(cur);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !cur)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;

    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    old_value = *cur;
    *cur = nk_do_progress(&ctx->last_widget_state, &win->buffer, bounds,
            *cur, max, is_modifyable, &style->progress, in);
    return (*cur != old_value);
}